

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_Brep::SetTrimIsoFlags(ON_Brep *this,ON_BrepFace *face)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)(face->m_li).m_count;
  if (lVar4 < 1) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    lVar3 = 0;
    do {
      bVar1 = SetTrimIsoFlags(this,(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                                   super_ON_ClassArray<ON_BrepLoop>.m_a + (face->m_li).m_a[lVar3]);
      bVar2 = (bool)(bVar2 & bVar1);
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  return bVar2;
}

Assistant:

ON_BrepEdge::ON_BrepEdge() 
  : ON_CurveProxy(0)
{
  memset(&m_edge_user,0,sizeof(m_edge_user));
  m_vi[0] = m_vi[1] = -1;
}